

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.c++
# Opt level: O2

char * __thiscall kj::StringTree::flattenTo(StringTree *this,char *target)

{
  Branch *pBVar1;
  size_t sVar2;
  long lVar3;
  char *pcVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  StringTree *this_00;
  char *local_40;
  anon_class_8_1_6ca262cf local_38;
  
  local_38.target = &local_40;
  pBVar1 = (this->branches).ptr;
  uVar6 = 0;
  local_40 = target;
  for (lVar3 = (this->branches).size_ << 6; this_00 = &pBVar1->content, lVar3 != 0;
      lVar3 = lVar3 + -0x40) {
    sVar5 = *(ulong *)((long)(this_00 + -1) + 0x30) - uVar6;
    if (uVar6 <= *(ulong *)((long)(this_00 + -1) + 0x30) && sVar5 != 0) {
      pcVar4 = "";
      if ((this->text).content.size_ != 0) {
        pcVar4 = (this->text).content.ptr;
      }
      memcpy(local_40,pcVar4 + uVar6,sVar5);
      local_40 = local_40 + sVar5;
      uVar6 = *(ulong *)((long)(this_00 + -1) + 0x30);
    }
    visit<kj::StringTree::flattenTo(char*)const::__0&>(this_00,&local_38);
    pBVar1 = (Branch *)(this_00 + 1);
  }
  sVar2 = (this->text).content.size_;
  uVar7 = 0;
  if (sVar2 != 0) {
    uVar7 = sVar2 - 1;
  }
  sVar5 = uVar7 - uVar6;
  if (uVar6 <= uVar7 && sVar5 != 0) {
    if (sVar2 == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (this->text).content.ptr;
    }
    memcpy(local_40,pcVar4 + uVar6,sVar5);
    local_40 = local_40 + sVar5;
  }
  return local_40;
}

Assistant:

char* StringTree::flattenTo(char* __restrict__ target) const {
  visit([&target](ArrayPtr<const char> text) {
    memcpy(target, text.begin(), text.size());
    target += text.size();
  });
  return target;
}